

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall
QL_Manager::SetUpNodesWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s;
  QL_Node **topNode_00;
  RC RVar1;
  int iVar2;
  RC RVar3;
  size_t __n;
  QL_NodeProj *this_00;
  QL_Node *currNode;
  ulong uVar4;
  char **ppcVar5;
  bool bVar6;
  bool bVar7;
  RelAttr attr;
  int attrIndex;
  int local_54;
  QO_Rel *local_50;
  QL_Manager *local_48;
  QL_Node **local_40;
  QL_NodeProj *local_38;
  
  RVar1 = SetUpFirstNodeWithQO(this,topNode,qorels);
  if (RVar1 == 0) {
    currNode = *topNode;
    bVar6 = 1 < this->nRels;
    local_50 = qorels;
    local_48 = this;
    local_40 = topNode;
    if (this->nRels < 2) {
      RVar3 = 0;
    }
    else {
      RVar1 = JoinRelationWithQO(this,topNode,qorels,currNode,1);
      topNode_00 = local_40;
      RVar3 = RVar1;
      if (RVar1 == 0) {
        iVar2 = 2;
        do {
          currNode = *topNode_00;
          bVar6 = iVar2 < local_48->nRels;
          if (local_48->nRels <= iVar2) {
            RVar3 = 0;
            break;
          }
          RVar1 = JoinRelationWithQO(local_48,topNode_00,local_50,currNode,iVar2);
          iVar2 = iVar2 + 1;
          RVar3 = RVar1;
        } while (RVar1 == 0);
      }
    }
    if (!bVar6) {
      if (nSelAttrs == 1) {
        __s = selAttrs->attrName;
        __n = strlen(__s);
        iVar2 = strncmp(__s,"*",__n);
        if (iVar2 == 0) {
          return 0;
        }
      }
      this_00 = (QL_NodeProj *)operator_new(0x60);
      QL_NodeProj::QL_NodeProj(this_00,local_48,currNode);
      local_38 = this_00;
      QL_NodeProj::SetUpNode(this_00,nSelAttrs);
      bVar6 = 0 < nSelAttrs;
      if (0 < nSelAttrs) {
        ppcVar5 = &selAttrs->attrName;
        uVar4 = 1;
        local_50 = (QO_Rel *)(ulong)(uint)nSelAttrs;
        do {
          local_54 = 0;
          attr.attrName = *ppcVar5;
          attr.relName = ((RelAttr *)(ppcVar5 + -1))->relName;
          RVar3 = GetAttrCatEntryPos(local_48,attr,&local_54);
          if (RVar3 == 0) {
            RVar3 = QL_NodeProj::AddProj(local_38,local_54);
            bVar7 = RVar3 == 0;
            if (!bVar7) {
              RVar1 = RVar3;
            }
          }
          else {
            bVar7 = false;
            RVar1 = RVar3;
          }
          if (!bVar7) break;
          bVar6 = uVar4 < local_50;
          ppcVar5 = ppcVar5 + 2;
          bVar7 = uVar4 != (uint)nSelAttrs;
          uVar4 = uVar4 + 1;
        } while (bVar7);
      }
      if (!bVar6) {
        *local_40 = &local_38->super_QL_Node;
        RVar1 = RVar3;
      }
    }
  }
  return RVar1;
}

Assistant:

RC QL_Manager::SetUpNodesWithQO(QL_Node *&topNode, QO_Rel* qorels, int nSelAttrs, const RelAttr selAttrs[]){
  RC rc = 0;
  if((rc = SetUpFirstNodeWithQO(topNode, qorels)))
    return (rc);

  // For all other relations, join it, left-deep style, with the previously
  // seen relations
  QL_Node* currNode;
  currNode = topNode;
  for(int i = 1; i < nRels; i++){
    if((rc = JoinRelationWithQO(topNode, qorels, currNode, i)))
      return (rc);
    currNode = topNode;
  }

  // If select *, don't add project nodes
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);
  // Otherwise, add a project node, and give it the attributes to project
  QL_NodeProj *projNode = new QL_NodeProj(*this, *currNode);
  projNode->SetUpNode(nSelAttrs);
  for(int i= 0 ; i < nSelAttrs; i++){
    int attrIndex = 0;
    if((rc = GetAttrCatEntryPos(selAttrs[i], attrIndex)))
      return (rc);
    if((rc = projNode->AddProj(attrIndex)))
      return (rc);
  }
  topNode = projNode;
  return (rc);
}